

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

uint64_t float128_to_uint64_round_to_zero_sparc(float128 a,float_status *status)

{
  char cVar1;
  uint64_t uVar2;
  char current_rounding_mode;
  uint64_t v;
  float_status *status_local;
  float128 a_local;
  
  cVar1 = status->float_rounding_mode;
  set_float_rounding_mode(3,status);
  uVar2 = float128_to_uint64_sparc(a,status);
  set_float_rounding_mode((int)cVar1,status);
  return uVar2;
}

Assistant:

uint64_t float128_to_uint64_round_to_zero(float128 a, float_status *status)
{
    uint64_t v;
    signed char current_rounding_mode = status->float_rounding_mode;

    set_float_rounding_mode(float_round_to_zero, status);
    v = float128_to_uint64(a, status);
    set_float_rounding_mode(current_rounding_mode, status);

    return v;
}